

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdPluginLib.h
# Opt level: O3

ExtensionPtr __thiscall
plugin::StdPluginLib::GetExtension(StdPluginLib *this,InterfaceId *interface)

{
  undefined8 *puVar1;
  long *plVar2;
  element_type *peVar3;
  char cVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  undefined8 *puVar6;
  ExtensionPtr EVar7;
  long *local_50 [2];
  long local_40 [2];
  
  puVar6 = (undefined8 *)(interface->m_name)._M_string_length;
  puVar1 = (undefined8 *)(interface->m_name).field_2._M_allocated_capacity;
  _Var5._M_pi = in_RDX;
  if (puVar6 != puVar1) {
    do {
      plVar2 = (long *)*puVar6;
      peVar3 = ((__shared_ptr<plugin::interfaces::IPluginInterface,_(__gnu_cxx::_Lock_policy)2> *)
               &in_RDX->_vptr__Sp_counted_base)->_M_ptr;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,peVar3,
                 (long)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&in_RDX->_M_use_count)->_M_pi
                        ->_vptr__Sp_counted_base + (long)peVar3);
      cVar4 = (**(code **)(*plVar2 + 0x18))(plVar2,(string *)local_50);
      _Var5._M_pi = extraout_RDX;
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
        _Var5._M_pi = extraout_RDX_00;
      }
      if (cVar4 != '\0') {
        (this->super_IPluginLib)._vptr_IPluginLib = (_func_int **)*puVar6;
        _Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar6[1];
        (this->m_extensions).
        super__Vector_base<std::shared_ptr<plugin::interfaces::IPluginInterface>,_std::allocator<std::shared_ptr<plugin::interfaces::IPluginInterface>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)_Var5._M_pi;
        if (_Var5._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(_Var5._M_pi)->_M_use_count)->
                     _M_pi =
                 *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                          &(_Var5._M_pi)->_M_use_count)->_M_pi + 1;
            UNLOCK();
          }
          else {
            *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(_Var5._M_pi)->_M_use_count)->
                     _M_pi =
                 *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                          &(_Var5._M_pi)->_M_use_count)->_M_pi + 1;
          }
        }
        goto LAB_001050ad;
      }
      puVar6 = puVar6 + 2;
    } while (puVar6 != puVar1);
  }
  (this->super_IPluginLib)._vptr_IPluginLib = (_func_int **)0x0;
  (this->m_extensions).
  super__Vector_base<std::shared_ptr<plugin::interfaces::IPluginInterface>,_std::allocator<std::shared_ptr<plugin::interfaces::IPluginInterface>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
LAB_001050ad:
  EVar7.super___shared_ptr<plugin::interfaces::IPluginInterface,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var5._M_pi;
  EVar7.super___shared_ptr<plugin::interfaces::IPluginInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (ExtensionPtr)
         EVar7.super___shared_ptr<plugin::interfaces::IPluginInterface,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ExtensionPtr const GetExtension(const plugin::InterfaceId& interface) const override
        {
            for(auto const& extension : m_extensions)
            {
                if(extension->RttiMatch(interface))
                {
                    return extension;
                }
            }

            return nullptr;
        }